

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookptravltree.h
# Opt level: O0

void __thiscall cookmem::PtrAVLTree::removeNode(PtrAVLTree *this,Node *root,Node **stack,int depth)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *apNStack_40260 [32767];
  Node *newRight;
  Node *parent;
  Node *min;
  Node *newStack [65];
  short local_42;
  Node *pNStack_40;
  int16_t newDepth;
  Node *newRoot;
  Node *right;
  Node *left;
  int depth_local;
  Node **stack_local;
  Node *root_local;
  PtrAVLTree *this_local;
  
  pNVar2 = root->left;
  newRoot = root->right;
  pNStack_40 = newRoot;
  if ((pNVar2 != (Node *)0x0) && (pNStack_40 = pNVar2, newRoot != (Node *)0x0)) {
    min = newRoot;
    local_42 = 0;
    while (newStack[(long)local_42 + -1]->left != (Node *)0x0) {
      newStack[(long)(local_42 + 1) + -1] = newStack[(long)local_42 + -1]->left;
      local_42 = local_42 + 1;
    }
    pNStack_40 = newStack[(long)local_42 + -1];
    if (pNStack_40 == newRoot) {
      setLeftChild(newRoot,pNVar2);
      pNStack_40 = newRoot;
    }
    else {
      newStack[(long)(local_42 + -1) + -1]->left = (Node *)0x0;
      pNVar1 = balance(&min,local_42);
      if (pNVar1 != (Node *)0x0) {
        newRoot = pNVar1;
      }
      setLeftChild(pNStack_40,pNVar2);
      setRightChild(pNStack_40,newRoot);
    }
  }
  if (depth == 0) {
    this->m_root = pNStack_40;
  }
  else if (pNStack_40 == (Node *)0x0) {
    if (root->size < stack[depth + -1]->size) {
      stack[depth + -1]->left = (Node *)0x0;
    }
    else {
      stack[depth + -1]->right = (Node *)0x0;
    }
    pNVar2 = balance(stack,(int16_t)depth);
    if (pNVar2 != (Node *)0x0) {
      this->m_root = pNVar2;
    }
  }
  else {
    setParent(pNStack_40,stack[depth + -1]);
    stack[depth] = pNStack_40;
    pNVar2 = balance(stack,(int16_t)depth);
    if (pNVar2 != (Node *)0x0) {
      this->m_root = pNVar2;
    }
  }
  return;
}

Assistant:

void
    removeNode (Node* root, Node** stack, int depth)
    {
        Node* left = root->left;
        Node* right = root->right;

        Node* newRoot;
        if (left == nullptr)
        {
            newRoot = right;
        }
        else if (right == nullptr)
        {
            newRoot = left;
        }
        else
        {
            // this is a more complicated case.
            // the solution is the move the smallest of the right branch
            // here.
            std::int16_t newDepth;
            Node* newStack[sizeof (Node*) * 8 + 1];
            newStack[0] = right;
            for (newDepth = 0; newStack[newDepth]->left != nullptr; ++newDepth)
            {
                newStack[newDepth + 1] = newStack[newDepth]->left;
            }
            Node* min = newStack[newDepth];
            if (min == right)
            {
                newRoot = right;
                setLeftChild (newRoot, left);
            }
            else
            {
                // first detach min from the parent
                Node* parent = newStack[newDepth - 1];
                parent->left = nullptr;

                // rebalance the right
                Node* newRight = balance (newStack, newDepth);
                if (newRight != nullptr)
                {
                    right = newRight;
                }

                setLeftChild (min, left);
                setRightChild (min, right);

                newRoot = min;
            }
        }

        if (depth == 0)
        {
            m_root = newRoot;
            return;
        }
        if (newRoot == nullptr)
        {
            // so root is the leaf.
            if (root->size < stack[depth - 1]->size)
            {
                stack[depth - 1]->left = nullptr;
            }
            else
            {
                stack[depth - 1]->right = nullptr;
            }
            newRoot = balance (stack, depth);
            if (newRoot != nullptr)
            {
                m_root = newRoot;
            }
            return;
        }

        setParent (newRoot, stack[depth - 1]);

        stack[depth] = newRoot;
        newRoot = balance (stack, depth);

        if (newRoot != nullptr)
        {
            m_root = newRoot;
        }
    }